

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O3

void __thiscall bandit::context::bandit::~bandit(bandit *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_interface)._vptr_interface = (_func_int **)&PTR__bandit_0011dc30;
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->after_eaches_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->before_eaches_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  pcVar2 = (this->desc_)._M_dataplus._M_p;
  paVar1 = &(this->desc_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

bandit(const std::string& desc, bool hard_skip_a)
          : desc_(desc), hard_skip_(hard_skip_a), is_executing_(false) {}